

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *needed)

{
  cmRuntimeDependencyArchive *this_00;
  bool bVar1;
  int iVar2;
  Status *pSVar3;
  ostream *poVar4;
  uv_loop_t *puVar5;
  char *string;
  string local_9b8;
  undefined1 local_998 [8];
  ostringstream e_2;
  string local_820;
  undefined1 local_800 [8];
  ostringstream e_1;
  string local_688;
  undefined1 local_668 [8];
  RegularExpressionMatch match;
  cmUVPipeIStream output;
  string line;
  undefined1 local_280 [8];
  ostringstream e;
  undefined1 local_108 [8];
  cmUVProcessChain process;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  undefined1 local_88 [8];
  cmUVProcessChainBuilder builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *needed_local;
  string *file_local;
  cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool *this_local;
  
  builder.Loop = (uv_loop_t *)needed;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_88);
  cmUVProcessChainBuilder::SetBuiltinStream((cmUVProcessChainBuilder *)local_88,Stream_OUTPUT);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_b0);
  this_00 = (this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool).Archive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"objdump",&local_d1);
  bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,&local_d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b0,
               (char (*) [3])"-p");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_b0,file);
    cmUVProcessChainBuilder::AddCommand
              ((cmUVProcessChainBuilder *)local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_b0);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_108);
    bVar1 = cmUVProcessChain::Valid((cmUVProcessChain *)local_108);
    if ((bVar1) &&
       (pSVar3 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_108,0),
       pSVar3->SpawnResult == 0)) {
      std::__cxx11::string::string((string *)&output.field_0x198);
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::regex == '\0') &&
         (iVar2 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::regex), iVar2 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::regex,"^[\t ]*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::regex,&__dso_handle)
        ;
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::regex);
      }
      puVar5 = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_108);
      iVar2 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_108);
      cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
                ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)&match.searchstring,puVar5,
                 iVar2);
      while (bVar1 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&match.searchstring,(string *)&output.field_0x198,
                                (bool *)0x0,0xffffffffffffffff), bVar1) {
        cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_668);
        string = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find
                          (&GetFileInfo::regex,string,(RegularExpressionMatch *)local_668);
        puVar5 = builder.Loop;
        if (bVar1) {
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_688,(RegularExpressionMatch *)local_668,1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)puVar5,&local_688);
          std::__cxx11::string::~string((string *)&local_688);
        }
      }
      bVar1 = cmUVProcessChain::Wait((cmUVProcessChain *)local_108,0);
      if (bVar1) {
        pSVar3 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_108,0);
        if (pSVar3->ExitStatus == 0) {
          this_local._7_1_ = true;
          process.Data._M_t.
          super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
          .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
          poVar4 = std::operator<<((ostream *)local_998,"Failed to run objdump on:\n  ");
          std::operator<<(poVar4,(string *)file);
          std::__cxx11::ostringstream::str();
          cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,&local_9b8);
          std::__cxx11::string::~string((string *)&local_9b8);
          this_local._7_1_ = false;
          process.Data._M_t.
          super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
          ._M_t.
          super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
          .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_800);
        poVar4 = std::operator<<((ostream *)local_800,"Failed to wait on objdump process for:\n  ");
        std::operator<<(poVar4,(string *)file);
        std::__cxx11::ostringstream::str();
        cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,&local_820);
        std::__cxx11::string::~string((string *)&local_820);
        this_local._7_1_ = false;
        process.Data._M_t.
        super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
        .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_800);
      }
      cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream
                ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)&match.searchstring);
      std::__cxx11::string::~string((string *)&output.field_0x198);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_280);
      poVar4 = std::operator<<((ostream *)local_280,"Failed to start objdump process for:\n  ");
      std::operator<<(poVar4,(string *)file);
      std::__cxx11::ostringstream::str();
      cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,
                 (string *)((long)&line.field_2 + 8));
      std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
      this_local._7_1_ = false;
      process.Data._M_t.
      super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
      .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_280);
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_108);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"Could not find objdump",
               (allocator<char> *)
               ((long)&process.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    cmBinUtilsWindowsPEGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsWindowsPEGetRuntimeDependenciesTool,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&process.Data._M_t.
                       super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
                       .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false> + 7));
    this_local._7_1_ = false;
    process.Data._M_t.
    super___uniq_ptr_impl<cmUVProcessChain::InternalData,_std::default_delete<cmUVProcessChain::InternalData>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmUVProcessChain::InternalData_*,_std::default_delete<cmUVProcessChain::InternalData>_>
    .super__Head_base<0UL,_cmUVProcessChain::InternalData_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_88);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::GetFileInfo(
  const std::string& file, std::vector<std::string>& needed)
{
  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT);

  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("objdump", command)) {
    this->SetError("Could not find objdump");
    return false;
  }
  command.emplace_back("-p");
  command.push_back(file);
  builder.AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    std::ostringstream e;
    e << "Failed to start objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression regex(
    "^[\t ]*DLL Name: ([^\n]*\\.[Dd][Ll][Ll])$");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (cmSystemTools::GetLineFromStream(output, line)) {
    cmsys::RegularExpressionMatch match;
    if (regex.find(line.c_str(), match)) {
      needed.push_back(match.match(1));
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on objdump process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run objdump on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}